

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O3

void __thiscall KDReports::HeaderMap::~HeaderMap(HeaderMap *this)

{
  _Base_ptr this_00;
  _Base_ptr p_Var1;
  
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::detach
            (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  p_Var1 = *(_Base_ptr *)
            ((long)&(((this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d
                     )->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  while( true ) {
    QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::detach
              (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
    if ((_Rb_tree_header *)p_Var1 ==
        &(((this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d)->m)._M_t.
         _M_impl.super__Rb_tree_header) break;
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      Header::~Header((Header *)this_00);
    }
    operator_delete(this_00,8);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>_>
              *)this);
  return;
}

Assistant:

~HeaderMap()
    {
        for (iterator it = begin(); it != end(); ++it) {
            delete *it;
        }
    }